

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O0

void __thiscall Error::Private::Framework::Framework(Framework *this)

{
  code *pcVar1;
  int iVar2;
  pthread_mutexattr_t local_14;
  Framework *pFStack_10;
  pthread_mutexattr_t attr;
  Framework *this_local;
  
  pFStack_10 = this;
  pthread_mutexattr_init(&local_14);
  iVar2 = pthread_mutex_init((pthread_mutex_t *)&mutex,&local_14);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Error.cpp"
                          ,0x47,"pthread_mutex_init(&mutex, &attr) == 0");
    if (iVar2 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return;
}

Assistant:

Framework()
    {
#ifdef _WIN32
      InitializeCriticalSection(&cs);
#else
      pthread_mutexattr_t attr; // TODO: use global var for this?
      pthread_mutexattr_init(&attr);
      VERIFY(pthread_mutex_init(&mutex, &attr) == 0);
#endif
    }